

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::updateGapIndicator(QMainWindowLayout *this)

{
  long lVar1;
  QLatin1StringView str;
  bool bVar2;
  QDockWidgetGroupWindow *pQVar3;
  QAnyStringView *this_00;
  QDockWidgetGroupWindow *pQVar4;
  QRubberBand *pQVar5;
  QWidget *this_01;
  int iVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool sigBlockState;
  QWidget *expectedParent;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmainwindowlayout_cpp:2989:41)>
  resetSignals;
  QRect *in_stack_ffffffffffffff68;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmainwindowlayout_cpp:2989:41)>
  *in_stack_ffffffffffffff70;
  QWidget *in_stack_ffffffffffffff80;
  QDockWidgetGroupWindow *parent;
  Shape in_stack_ffffffffffffff9c;
  QRubberBand *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidgetAnimator::animating((QWidgetAnimator *)0x5f9a87);
  if ((bVar2) ||
     ((bVar2 = QList<int>::isEmpty((QList<int> *)0x5f9aa0), bVar2 &&
      (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5f9ab7),
      !bVar2)))) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QRubberBand> *)0x5f9d45);
    if (bVar2) {
      QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9d5c);
      QWidget::hide((QWidget *)0x5f9d64);
    }
  }
  else {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5f9ad1);
    if (bVar2) {
      pQVar3 = QPointer<QDockWidgetGroupWindow>::data((QPointer<QDockWidgetGroupWindow> *)0x5f9ae8);
    }
    else {
      pQVar3 = (QDockWidgetGroupWindow *)QLayout::parentWidget((QLayout *)in_stack_ffffffffffffff80)
      ;
    }
    parent = pQVar3;
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QRubberBand> *)0x5f9b19);
    if (bVar2) {
      QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9bc4);
      pQVar4 = (QDockWidgetGroupWindow *)QObject::parent((QObject *)0x5f9bcc);
      if (pQVar4 != pQVar3) {
        QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9be4);
        QWidget::setParent(in_RDI,&parent->super_QWidget);
      }
      iVar6 = (int)in_RDI;
    }
    else {
      this_00 = (QAnyStringView *)operator_new(0x28);
      QRubberBand::QRubberBand(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_RDI);
      iVar6 = (int)in_RDI;
      QPointer<QRubberBand>::operator=
                ((QPointer<QRubberBand> *)in_stack_ffffffffffffff70,
                 (QRubberBand *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff80 =
           &QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9b69)->super_QWidget;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this_00,(size_t)in_stack_ffffffffffffff70);
      str.m_data = (char *)parent;
      str.m_size = (qsizetype)in_stack_ffffffffffffff80;
      QAnyStringView::QAnyStringView(this_00,str);
      QObject::setObjectName((QAnyStringView *)in_stack_ffffffffffffff80);
    }
    QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9c04);
    QObject::signalsBlocked((QObject *)0x5f9c0c);
    qScopeGuard<QMainWindowLayout::updateGapIndicator()::__0>
              ((anon_class_16_2_601c8fa2_for_m_func *)in_stack_ffffffffffffff68);
    pQVar5 = QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9c73);
    QObject::blockSignals(SUB81(pQVar5,0));
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5f9c91);
    if (bVar2) {
      in_stack_ffffffffffffff70 =
           (QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmainwindowlayout_cpp:2989:41)>
            *)QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9ca8);
      pQVar3 = QPointer<QDockWidgetGroupWindow>::operator->
                         ((QPointer<QDockWidgetGroupWindow> *)0x5f9cbe);
      iVar6 = (int)pQVar3 + 0x28;
      QRubberBand::setGeometry((QRubberBand *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9ce2);
      iVar6 = iVar6 + 0x7c8;
      QRubberBand::setGeometry((QRubberBand *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9d07);
    QWidget::show(in_stack_ffffffffffffff80);
    this_01 = &QPointer<QRubberBand>::operator->((QPointer<QRubberBand> *)0x5f9d20)->super_QWidget;
    QWidget::raise(this_01,iVar6);
    QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qmainwindowlayout.cpp:2989:41)>
    ::~QScopeGuard(in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::updateGapIndicator()
{
#if QT_CONFIG(rubberband)
    if (!widgetAnimator.animating() && (!currentGapPos.isEmpty()
#if QT_CONFIG(dockwidget)
                                        || currentHoveredFloat
#endif
                                        )) {
        QWidget *expectedParent =
#if QT_CONFIG(dockwidget)
            currentHoveredFloat ? currentHoveredFloat.data() :
#endif
            parentWidget();
        if (!gapIndicator) {
            gapIndicator = new QRubberBand(QRubberBand::Rectangle, expectedParent);
            // For accessibility to identify this special widget.
            gapIndicator->setObjectName("qt_rubberband"_L1);
        } else if (gapIndicator->parent() != expectedParent) {
            gapIndicator->setParent(expectedParent);
        }

        // Prevent re-entry in case of size change
        const bool sigBlockState = gapIndicator->signalsBlocked();
        auto resetSignals = qScopeGuard([this, sigBlockState](){ gapIndicator->blockSignals(sigBlockState); });
        gapIndicator->blockSignals(true);

#if QT_CONFIG(dockwidget)
        if (currentHoveredFloat)
            gapIndicator->setGeometry(currentHoveredFloat->currentGapRect);
        else
#endif
            gapIndicator->setGeometry(currentGapRect);

        gapIndicator->show();
        gapIndicator->raise();

        // Reset signal state

    } else if (gapIndicator) {
        gapIndicator->hide();
    }

#endif // QT_CONFIG(rubberband)
}